

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>>>>
::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)86>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<263u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<264u,Fixpp::Type::Int>>,Fixpp::TagT<265u,Fixpp::Type::Int>,Fixpp::TagT<266u,Fixpp::Type::Boolean>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<267u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<146u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<55u,Fixpp::Type::String>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::TagT<336u,Fixpp::Type::String>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>>>>
           *this,Field *field,ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_V_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<263U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<264U,_Fixpp::Type::Int>_>,_Fixpp::TagT<265U,_Fixpp::Type::Int>,_Fixpp::TagT<266U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<55U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>_>_>
          *tagSet,bool strict,bool skipUnknown)

{
  StreamCursor *this_00;
  StreamBuf<char> *pSVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  Type type;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint unaff_R12D;
  uint uVar15;
  int unaff_R14D;
  int iVar16;
  byte *pbVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auStack_1e8 [8];
  GroupType groupRef;
  undefined1 auStack_b8 [8];
  GroupSet groupSet;
  Visitor visitor;
  
  this_00 = context->cursor;
  pSVar1 = this_00->buf;
  if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
     (lVar7 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar7 == 0)) {
    bVar18 = false;
  }
  else {
    pSVar1 = this_00->buf;
    pbVar17 = *(byte **)&pSVar1->field_0x10;
    lVar7 = *(long *)&pSVar1->field_0x18 - (long)pbVar17;
    if (lVar7 == 0) {
      lVar7 = (**(code **)(*(long *)pSVar1 + 0x38))();
    }
    sVar11 = 0;
    unaff_R14D = 0;
    do {
      if ((byte)(*pbVar17 - 0x30) < 10) {
        unaff_R14D = (uint)*pbVar17 + unaff_R14D * 10 + -0x30;
        sVar11 = sVar11 + 1;
        lVar7 = lVar7 + -1;
        bVar18 = lVar7 != 0;
      }
      else {
        bVar18 = false;
      }
      pbVar17 = pbVar17 + 1;
    } while (bVar18);
    bVar18 = sVar11 != 0;
    if (bVar18) {
      StreamCursor::advance(this_00,sVar11);
      bVar18 = true;
    }
  }
  if (!bVar18) {
    pSVar1 = this_00->buf;
    if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
       (lVar7 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar7 == 0)) {
      uVar14 = 0x3f;
    }
    else {
      pSVar1 = this_00->buf;
      if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
        cVar6 = **(char **)&pSVar1->field_0x10;
      }
      else {
        cVar6 = (**(code **)(*(long *)pSVar1 + 0x48))();
      }
      uVar14 = (ulong)(uint)(int)cVar6;
    }
    ParsingContext::setError
              (context,ParsingError,
               "Could not parse instances number in RepeatingGroup %d, expected int, got \'%c\'",
               0x10b,uVar14);
    return;
  }
  bVar18 = StreamCursor::advance(this_00,1);
  if (unaff_R14D == 0) {
    if (!bVar18) {
      pcVar10 = "Got early EOF after tag %d value";
      goto LAB_00949c2e;
    }
  }
  else {
    if (!bVar18) {
      pcVar10 = "Expected RepeatingGroup %d, got EOF";
LAB_00949c2e:
      ParsingContext::setError(context,Incomplete,pcVar10,0x10b);
      return;
    }
    if ((ulong)(((long)(field->values).
                       super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_void>
                       .super_SmallVectorBase.CapacityX -
                 (long)(field->values).
                       super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_void>
                       .super_SmallVectorBase.BeginX >> 3) * 0x14c1bacf914c1bad) <
        (ulong)(long)unaff_R14D) {
      llvm::
      SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_false>
      ::grow((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_false>
              *)field,(long)unaff_R14D);
    }
    groupSet.bits.super__Base_bitset<5UL>._M_w[1] = 0;
    groupSet.bits.super__Base_bitset<5UL>._M_w[2] = 0;
    auStack_b8 = (undefined1  [8])0x0;
    groupSet.bits.super__Base_bitset<5UL>._M_w[0] = 0;
    groupSet.bits.super__Base_bitset<5UL>._M_w[3] = 0;
    bVar18 = true;
    do {
      groupRef.super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.allBits.
      super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)
           ((long)&groupRef.
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.
                   unparsed.
                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                   .
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                   .
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                   .super_SmallVectorBase + 0x10);
      auStack_1e8 = (undefined1  [8])0x0;
      groupRef.super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.values.base
      .super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_false>.value.
      m_view.first = (char *)0x0;
      groupRef.super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>._16_8_ = 0;
      groupRef.super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.unparsed.
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
      .
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
      .super_SmallVectorBase.EndX =
           (void *)((long)groupRef.
                          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.
                          unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer +
                   0x10);
      groupRef.super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.unparsed.
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
      .
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
      .super_SmallVectorBase.BeginX =
           (void *)groupRef.
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.allBits
                   .super__Base_bitset<1UL>._M_w;
      bVar5 = bVar18;
      do {
        pSVar1 = this_00->buf;
        uVar2 = *(undefined8 *)&pSVar1->field_0x8;
        lVar7 = *(long *)&pSVar1->field_0x10;
        lVar3 = *(long *)&pSVar1->field_0x18;
        if ((lVar3 == lVar7) && (lVar8 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar8 == 0)) {
          bVar19 = false;
        }
        else {
          pSVar1 = this_00->buf;
          pbVar17 = *(byte **)&pSVar1->field_0x10;
          lVar8 = *(long *)&pSVar1->field_0x18 - (long)pbVar17;
          if (lVar8 == 0) {
            lVar8 = (**(code **)(*(long *)pSVar1 + 0x38))();
          }
          sVar11 = 0;
          uVar15 = 0;
          do {
            if ((byte)(*pbVar17 - 0x30) < 10) {
              uVar15 = ((uint)*pbVar17 + uVar15 * 10) - 0x30;
              sVar11 = sVar11 + 1;
              lVar8 = lVar8 + -1;
              bVar18 = lVar8 != 0;
            }
            else {
              bVar18 = false;
            }
            pbVar17 = pbVar17 + 1;
          } while (bVar18);
          bVar19 = sVar11 != 0;
          if (bVar19) {
            bVar19 = true;
            StreamCursor::advance(this_00,sVar11);
            unaff_R12D = uVar15;
          }
        }
        bVar18 = bVar5;
        if (bVar19) {
          uVar14 = 0;
          lVar8 = 0;
          do {
            lVar13 = lVar8;
            uVar12 = uVar14;
            if (unaff_R12D == 0x10d) break;
            uVar14 = (ulong)(0x10d < (int)unaff_R12D);
            lVar8 = -(ulong)((int)unaff_R12D < 0x10d);
          } while ((long)uVar12 <= lVar13);
          if (lVar13 < (long)uVar12) {
            lVar8 = 6;
            lVar13 = 0;
            uVar14 = (ulong)(0x10d < (int)unaff_R12D);
            do {
              if (lVar8 < lVar13) {
                uVar12 = 0xffffffffffffffff;
                break;
              }
              uVar12 = (lVar8 + lVar13) / 2;
              uVar15 = details::
                       IndexesImpl<meta::pack::Pack<Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<263U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<264U,_Fixpp::Type::Int>_>,_Fixpp::TagT<265U,_Fixpp::Type::Int>,_Fixpp::TagT<266U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<55U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>_>_>
                       ::Sorted.arr[uVar12];
              if (uVar15 != unaff_R12D) {
                if ((int)uVar15 < (int)unaff_R12D) {
                  lVar13 = uVar12 + 1;
                  uVar12 = uVar14;
                }
                else {
                  lVar8 = uVar12 - 1;
                  uVar12 = uVar14;
                }
              }
              uVar14 = uVar12;
            } while (uVar15 != unaff_R12D);
            iVar16 = 10;
            bVar19 = true;
            bVar18 = false;
            if ((uVar12 == 0xffffffffffffffff) && (unaff_R12D != 10)) {
              bVar18 = StreamCursor::advance(this_00,1);
              pcVar10 = "Expected value after tag %d, got EOF";
              if (bVar18) {
                lVar8 = *(long *)&this_00->buf->field_0x8;
                lVar13 = *(long *)&this_00->buf->field_0x10;
                while( true ) {
                  pSVar1 = this_00->buf;
                  if (*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) {
                    lVar9 = (**(code **)(*(long *)pSVar1 + 0x38))();
                    bVar18 = lVar9 == 0;
                  }
                  else {
                    bVar18 = false;
                  }
                  iVar16 = 1;
                  if (bVar18) {
                    type = ParsingError;
                    pcVar10 = "Expected value after tag %d, got EOF";
                    goto LAB_00949a2f;
                  }
                  pSVar1 = this_00->buf;
                  if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
                    cVar6 = **(char **)&pSVar1->field_0x10;
                  }
                  else {
                    cVar6 = (**(code **)(*(long *)pSVar1 + 0x48))();
                  }
                  if (cVar6 == '|') break;
                  StreamCursor::advance(this_00,1);
                }
                if (strict) {
                  bVar19 = false;
                  ParsingContext::setError
                            (context,UnknownTag,"Encountered unknown tag %d in RepeatingGroup %d",
                             (ulong)unaff_R12D);
                  bVar18 = bVar5;
                }
                else {
                  if (!skipUnknown) {
                    lVar9 = *(long *)&this_00->buf->field_0x10;
                    lVar4 = *(long *)&this_00->buf->field_0x8;
                    if (groupRef.
                        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.
                        unparsed.
                        super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                        .
                        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                        .
                        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                        .super_SmallVectorBase.EndX <=
                        groupRef.
                        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.
                        unparsed.
                        super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                        .
                        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                        .
                        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                        .super_SmallVectorBase.BeginX) {
                      llvm::
                      SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                      ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                              *)&groupRef.
                                 super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>
                                 .allBits,0);
                    }
                    *(uint *)groupRef.
                             super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>
                             .unparsed.
                             super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                             .
                             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                             .
                             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                             .super_SmallVectorBase.BeginX = unaff_R12D;
                    *(long *)((long)groupRef.
                                    super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>
                                    .unparsed.
                                    super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                                    .
                                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                                    .
                                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                                    .super_SmallVectorBase.BeginX + 8) = lVar13;
                    *(long *)((long)groupRef.
                                    super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>
                                    .unparsed.
                                    super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                                    .
                                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                                    .
                                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                                    .super_SmallVectorBase.BeginX + 0x10) =
                         (lVar8 + lVar9) - (lVar4 + lVar13);
                    groupRef.
                    super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.
                    unparsed.
                    super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                    .
                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                    .
                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                    .super_SmallVectorBase.BeginX =
                         (void *)((long)groupRef.
                                        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>
                                        .unparsed.
                                        super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                                        .
                                        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                                        .
                                        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                                        .super_SmallVectorBase.BeginX + 0x18);
                  }
                  bVar18 = StreamCursor::advance(this_00,1);
                  type = Incomplete;
                  if (bVar18) {
                    iVar16 = 0xb;
                    goto LAB_009499dd;
                  }
                  pcVar10 = "Got early EOF after tag %d value";
LAB_00949a2f:
                  bVar19 = false;
                  ParsingContext::setError(context,type,pcVar10,(ulong)unaff_R12D);
                  bVar18 = bVar5;
                }
              }
              else {
LAB_009499e8:
                iVar16 = 1;
                bVar19 = false;
                ParsingContext::setError(context,Incomplete,pcVar10,(ulong)unaff_R12D);
                bVar18 = bVar5;
              }
            }
          }
          else {
            bVar19 = std::bitset<270UL>::test((bitset<270UL> *)auStack_b8,(ulong)unaff_R12D);
            if (bVar19) {
              iVar16 = 10;
              bVar19 = true;
            }
            else {
              bVar18 = StreamCursor::advance(this_00,1);
              pcVar10 = "Expected value after Tag %d, got EOF";
              if (!bVar18) goto LAB_009499e8;
              TagSet<Fixpp::TagT<269U,_Fixpp::Type::Char>_>::set
                        ((TagSet<Fixpp::TagT<269U,_Fixpp::Type::Char>_> *)auStack_b8,unaff_R12D);
              groupSet.bits.super__Base_bitset<5UL>._M_w[4]._0_1_ = '\0';
              doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>>>>::Visitor,0ul>
                        (auStack_1e8,unaff_R12D,groupSet.bits.super__Base_bitset<5UL>._M_w + 4);
              iVar16 = 0;
              if (((char)groupSet.bits.super__Base_bitset<5UL>._M_w[4] == '\0') &&
                 (bVar18 = StreamCursor::advance(this_00,1), !bVar18)) {
                iVar16 = 1;
                ParsingContext::setError
                          (context,Incomplete,"Got early EOF in RepeatingGroup %d",0x10b);
              }
LAB_009499dd:
              bVar19 = false;
              bVar18 = bVar5;
            }
          }
        }
        else {
          pSVar1 = this_00->buf;
          if (((*(long *)&pSVar1->field_0x18 != *(long *)&pSVar1->field_0x10) ||
              (lVar8 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar8 != 0)) &&
             (pSVar1 = this_00->buf, *(ulong *)&pSVar1->field_0x18 <= *(ulong *)&pSVar1->field_0x10)
             ) {
            (**(code **)(*(long *)pSVar1 + 0x48))();
          }
          iVar16 = 1;
          bVar19 = true;
          ParsingContext::setError
                    (context,ParsingError,
                     "Could not parse tag in RepeatingGroup %d, expected int, got \'%c\'",0x10b);
        }
        if (bVar19) {
          pSVar1 = this_00->buf;
          *(undefined8 *)&pSVar1->field_0x8 = uVar2;
          *(long *)&pSVar1->field_0x10 = lVar7;
          *(long *)&pSVar1->field_0x18 = lVar3;
        }
        bVar5 = bVar18;
      } while ((iVar16 == 0) || (iVar16 == 0xb));
      if (iVar16 == 10) {
        llvm::
        SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_false>
        ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>,_false>
                     *)field,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<267U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>
                              *)auStack_1e8);
        groupSet.bits.super__Base_bitset<5UL>._M_w[1] = 0;
        groupSet.bits.super__Base_bitset<5UL>._M_w[2] = 0;
        auStack_b8 = (undefined1  [8])0x0;
        groupSet.bits.super__Base_bitset<5UL>._M_w[0] = 0;
        groupSet.bits.super__Base_bitset<5UL>._M_w[3] = 0;
      }
      if (groupRef.super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.allBits
          .super__Base_bitset<1UL>._M_w !=
          (_Base_bitset<1UL>)
          ((long)&groupRef.super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>::Unparsed,_void>
                  .super_SmallVectorBase + 0x10U)) {
        free((void *)groupRef.
                     super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<269U,_Fixpp::Type::Char>_>.
                     allBits.super__Base_bitset<1UL>._M_w);
      }
    } while ((iVar16 == 10) && (bVar18));
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool strict, bool skipUnknown)
            {
                auto& cursor = context.cursor;

                int instances;
                TRY_MATCH_INT(
                    instances,
                    "Could not parse instances number in RepeatingGroup %d, expected int, got '%c'",
                     GroupTag::Id, CURSOR_CURRENT(cursor)
                );

                if (!instances)
                {
                    TRY_ADVANCE("Got early EOF after tag %d value", GroupTag::Id);
                    return;
                }

                // Literal('=')
                TRY_ADVANCE("Expected RepeatingGroup %d, got EOF", GroupTag::Id);

                field.reserve(instances);

                GroupSet groupSet;

                int tag;
                bool inGroup = true;

                do
                {
                    typename Field::GroupType groupRef;

                    for (;;)
                    {

                        StreamCursor::Revert revertTag(cursor);
                        TRY_MATCH_INT(
                            tag,
                            "Could not parse tag in RepeatingGroup %d, expected int, got '%c'",
                            GroupTag::Id, CURSOR_CURRENT(cursor)
                        );

                        // The tag we just encountered is invalid for the RepeatingGroup
                        if (!groupSet.valid(tag))
                        {
                            // If it's not valid for the Message either, we consider it to be
                            // a custom tag
                            if (!tagSet.valid(tag) && tag != 10)
                            {
                                revertTag.ignore();
                                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                                StreamCursor::Token valueToken(cursor);
                                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                                if (!strict)
                                {
                                    if (!skipUnknown)
                                        groupRef.unparsed.emplace_back(tag, valueToken.view());
                                    TRY_ADVANCE("Got early EOF after tag %d value", tag);
                                    continue;
                                }
                                else if (strict)
                                {
                                    context.setError(ErrorKind::UnknownTag, "Encountered unknown tag %d in RepeatingGroup %d", tag, GroupTag::Id);
                                    return;
                                }
                            }

                            inGroup = false;
                            break;
                        }

                        // The tag is already set in our GroupSet, we finished parsing the current instance
                        if (groupSet.test(tag))
                            break;

                        revertTag.ignore();

                        // Literal('=')
                        TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                        groupSet.set(tag);

                        Visitor visitor(context, groupSet, strict, skipUnknown);

                        // Invariant: here visitField should ALWAYS return true as we are checking if the tag
                        // is valid prior to the call
                        //
                        // TODO: enfore the invariant ?
                        visitField(groupRef, tag, visitor);

                        // If we are in a recursive RepeatingGroup parsing, we must *NOT* advance the cursor
                        if (!visitor.recursive)
                            TRY_ADVANCE("Got early EOF in RepeatingGroup %d", GroupTag::Id);
                    }

                    field.add(std::move(groupRef));
                    groupSet.reset();

                } while (inGroup);

            }